

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O1

TFactor<double> * __thiscall
libDAI::TFactor<double>::divided_by
          (TFactor<double> *__return_storage_ptr__,TFactor<double> *this,TFactor<double> *denom)

{
  TFactor(__return_storage_ptr__,this);
  TProb<double>::operator/=(&__return_storage_ptr__->_p,&denom->_p);
  return __return_storage_ptr__;
}

Assistant:

TFactor<T> divided_by( const TFactor<T>& denom ) const { 
#ifdef DEBUG
                assert( denom._vs == _vs );
#endif
                TFactor<T> quot(*this); 
                quot._p /= denom._p; 
                return quot; 
            }